

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

float FACT_INTERNAL_CalculateFilterFrequency(float desiredFrequency,uint32_t sampleRate)

{
  float fVar1;
  double dVar2;
  
  fVar1 = desiredFrequency / (float)sampleRate;
  if (0.5 <= fVar1) {
    fVar1 = 0.5;
  }
  dVar2 = (double)SDL_sin((double)(fVar1 * 3.1415927));
  fVar1 = (float)(dVar2 + dVar2);
  if (1.0 <= fVar1) {
    fVar1 = 1.0;
  }
  return fVar1;
}

Assistant:

static inline float FACT_INTERNAL_CalculateFilterFrequency(
	float desiredFrequency,
	uint32_t sampleRate
) {
	/* This is needed to convert linear frequencies to the value
	 * FAudio_INTERNAL_FilterVoice expects, in order for it to actually
	 * filter at the correct frequency.
	 *
	 * The formula is...
	 *
	 * (2 * sin(pi * (desired filter cutoff frequency) / sampleRate))
	 *
	 * ... but it behaves badly as the filter frequency gets too high as a
	 * fraction of the sample rate, hence the mins.
	 *
	 * -@Woflox
	 */
	float freq = 2 * FAudio_sin(
		F3DAUDIO_PI *
		FAudio_min(desiredFrequency / sampleRate, 0.5f)
	);
	return FAudio_min(freq, 1.0f);
}